

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O1

bool __thiscall QtPrivate::isLatin1(QtPrivate *this,QStringView s)

{
  ushort uVar1;
  bool bVar2;
  QtPrivate *pQVar3;
  long in_FS_OFFSET;
  char *ptr8;
  QtPrivate *local_18;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = this;
  bVar2 = simdTestMask((char **)&local_18,(char *)(this + (long)s.m_data * 2),0xff00ff00);
  pQVar3 = local_18;
  if (bVar2) {
    do {
      bVar2 = pQVar3 == this + (long)s.m_data * 2;
      if (bVar2) break;
      uVar1 = *(ushort *)pQVar3;
      pQVar3 = pQVar3 + 2;
    } while (uVar1 < 0x100);
  }
  else {
    bVar2 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_10) {
    __stack_chk_fail();
  }
  return bVar2;
}

Assistant:

bool QtPrivate::isLatin1(QStringView s) noexcept
{
    const char16_t *ptr = s.utf16();
    const char16_t *end = ptr + s.size();

#ifdef __SSE2__
    const char *ptr8 = reinterpret_cast<const char *>(ptr);
    const char *end8 = reinterpret_cast<const char *>(end);
    if (!simdTestMask(ptr8, end8, 0xff00ff00))
        return false;
    ptr = reinterpret_cast<const char16_t *>(ptr8);
#endif

    while (ptr != end) {
        if (*ptr++ > 0xff)
            return false;
    }
    return true;
}